

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_get(Table *t,TValue *key)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  TValue *pTVar4;
  Node *local_40;
  Node *n_1;
  luai_Cast u;
  lua_Number n;
  int k;
  TValue *key_local;
  Table *t_local;
  
  uVar2 = key->tt_ & 0x3f;
  if (uVar2 != 0) {
    if (uVar2 == 3) {
      dVar1 = (key->value_).n;
      n_1._0_4_ = SUB84(dVar1 + 6755399441055744.0,0);
      if (((double)(int)n_1 == dVar1) && (!NAN((double)(int)n_1) && !NAN(dVar1))) {
        pTVar4 = luaH_getint(t,(int)n_1);
        return pTVar4;
      }
    }
    else if (uVar2 == 4) {
      pTVar4 = luaH_getstr(t,&((key->value_).gc)->ts);
      return pTVar4;
    }
    local_40 = mainposition(t,key);
    do {
      if (((local_40->i_key).nk.tt_ == key->tt_) &&
         (iVar3 = luaV_equalobj_((lua_State *)0x0,&(local_40->i_key).tvk,key), iVar3 != 0)) {
        return &local_40->i_val;
      }
      local_40 = (local_40->i_key).nk.next;
    } while (local_40 != (Node *)0x0);
  }
  t_local = (Table *)&luaO_nilobject_;
  return (TValue *)t_local;
}

Assistant:

const TValue *luaH_get (Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TSHRSTR: return luaH_getstr(t, rawtsvalue(key));
    case LUA_TNIL: return luaO_nilobject;
    case LUA_TNUMBER: {
      int k;
      lua_Number n = nvalue(key);
      lua_number2int(k, n);
      if (luai_numeq(cast_num(k), n)) /* index is int? */
        return luaH_getint(t, k);  /* use specialized version */
      /* else go through */
    }
    default: {
      Node *n = mainposition(t, key);
      do {  /* check whether `key' is somewhere in the chain */
        if (luaV_rawequalobj(gkey(n), key))
          return gval(n);  /* that's it */
        else n = gnext(n);
      } while (n);
      return luaO_nilobject;
    }
  }
}